

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

void anon_unknown.dwarf_26820::show_usage(ostream *os)

{
  ostream *poVar1;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Benchmark 1 <type> <dic> <key> <pfxs...>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"- insert <key> and write the dictionary to <dic>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"- MLTs can give pre-registered prefixes on <pfxs...> (optional)")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"- <type>: DaTrie type");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    SGL      : Normal");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    SGL_NL   : With node-link");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    SGL_BL   : With block-link");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    SGL_NL_BL: With node- and block-links");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    MLT      : Using the trie division");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    MLT_NL   : With node-link");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    MLT_BL   : With block-link");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    MLT_NL_BL: With node- and block-links");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"Benchmark 2 <dic1> <dic2> <key>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"- delete <key> from <dic1> and write the dictionary to <dic2>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"Benchmark 3 <dic> <key>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"- search <key> for <dic>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"Benchmark 4 <rear> <dic1> <dic2>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "- rearrange <dic1> using <rear> and write the dictionary to <dic2>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"- <rear>: Rearrangement mode");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    1: pack()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"    2: rebuild()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"Benchmark 5 <dic> <key> <pat>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"- generate a random key set registered in <dic> to <key>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "- given <pat>, generate the patterns of random sub key sets (optional)")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void show_usage(std::ostream& os) {
  os << "Benchmark 1 <type> <dic> <key> <pfxs...>" << std::endl;
  os << "- insert <key> and write the dictionary to <dic>" << std::endl;
  os << "- MLTs can give pre-registered prefixes on <pfxs...> (optional)" << std::endl;
  os << "- <type>: DaTrie type" << std::endl;
  os << "    SGL      : Normal" << std::endl;
  os << "    SGL_NL   : With node-link" << std::endl;
  os << "    SGL_BL   : With block-link" << std::endl;
  os << "    SGL_NL_BL: With node- and block-links" << std::endl;
  os << "    MLT      : Using the trie division" << std::endl;
  os << "    MLT_NL   : With node-link" << std::endl;
  os << "    MLT_BL   : With block-link" << std::endl;
  os << "    MLT_NL_BL: With node- and block-links" << std::endl;
  os << "Benchmark 2 <dic1> <dic2> <key>" << std::endl;
  os << "- delete <key> from <dic1> and write the dictionary to <dic2>" << std::endl;
  os << "Benchmark 3 <dic> <key>" << std::endl;
  os << "- search <key> for <dic>" << std::endl;
  os << "Benchmark 4 <rear> <dic1> <dic2>" << std::endl;
  os << "- rearrange <dic1> using <rear> and write the dictionary to <dic2>" << std::endl;
  os << "- <rear>: Rearrangement mode" << std::endl;
  os << "    1: pack()" << std::endl;
  os << "    2: rebuild()" << std::endl;
  os << "Benchmark 5 <dic> <key> <pat>" << std::endl;
  os << "- generate a random key set registered in <dic> to <key>" << std::endl;
  os << "- given <pat>, generate the patterns of random sub key sets (optional)" << std::endl;
}